

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::~B3DImporter(B3DImporter *this)

{
  B3DImporter *this_local;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00dfe2a8;
  std::
  vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
  ::~vector(&this->_animations);
  std::
  vector<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
  ::~vector(&this->_nodeAnims);
  std::
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ::~vector(&this->_meshes);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector(&this->_nodes);
  std::vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::~vector
            (&this->_vertices);
  std::
  vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
  ::~vector(&this->_materials);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_textures);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->_stack);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_buf);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

B3DImporter::~B3DImporter()
{
}